

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O1

_Bool test_permute_cols(void)

{
  uint n;
  bool bVar1;
  ulong uVar2;
  int c;
  uint8_t *memory;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  int *arr;
  ulong uVar9;
  _Bool _Var10;
  undefined1 local_58 [8];
  m256v A;
  
  A.e = local_58;
  uVar9 = 0;
  _Var10 = false;
  do {
    n = (&DAT_001046d0)[uVar9];
    arr = (int *)(A.e + -((ulong)n * 4 + 0xf & 0xfffffffffffffff0));
    arr[-2] = 0x101fde;
    arr[-1] = 0;
    perm_rand(n,arr);
    memory = (uint8_t *)((long)arr - (ulong)(n * n + 0xf & 0xfffffff0));
    builtin_memcpy(memory + -8,"\x02 \x10",4);
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_make((m256v *)local_58,n,n,memory);
    uVar5 = 1;
    if (1 < (int)n) {
      uVar5 = (ulong)n;
    }
    uVar2 = 0;
    do {
      uVar3 = 0;
      do {
        *(bool *)(uVar3 + A._0_8_ * uVar2 + A.rstride) = uVar2 == uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar5);
    builtin_memcpy(memory + -8,"B \x10",4);
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_permute_cols((m256v *)local_58,arr);
    uVar2 = 1;
    if (1 < (int)n) {
      uVar2 = (ulong)n;
    }
    bVar1 = true;
    uVar3 = 0;
    pcVar4 = (char *)A.rstride;
    do {
      uVar6 = 0;
      pcVar8 = pcVar4;
      do {
        uVar7 = uVar6;
        if (*pcVar8 != '\0') break;
        uVar6 = uVar6 + 1;
        pcVar8 = pcVar8 + A._0_8_;
        uVar7 = uVar2;
      } while (uVar5 != uVar6);
      if ((int)uVar7 != arr[uVar3]) {
        if (bVar1) {
          return _Var10;
        }
        break;
      }
      uVar3 = uVar3 + 1;
      bVar1 = (long)uVar3 < (long)(int)n;
      pcVar4 = pcVar4 + 1;
    } while (uVar3 != uVar2);
    _Var10 = 5 < uVar9;
    uVar9 = uVar9 + 1;
    if (uVar9 == 7) {
      return _Var10;
    }
  } while( true );
}

Assistant:

static bool test_permute_cols()
{
	const int rowscols[] = { 1, 2, 3, 5, 8, 10, 15 };
	for (int i = 0; i < array_size(rowscols); ++i) {
		const int rc = rowscols[i];

		/* Generate a random permutation */
		int p[rc];
		perm_rand(rc, p);

		/* Generate identity matrix */
		m256v_Def(A, a, rc, rc);
		for (int r = 0; r < rc; ++r) {
			for (int c = 0; c < rc; ++c) {
				m256v_set_el(&A, r, c, r==c);
			}
		}

		/* Apply perm */
		m256v_permute_cols(&A, p);

		/* Check output is as expected */
		for (int c = 0; c < rc; ++c) {
			int j;
			for (j = 0; j < rc; ++j) {
				if (m256v_get_el(&A, j, c))
					break;
			}

			if (j != p[c])
				return false;
		}
	}

	return true;
}